

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

myarima_object
myarima(double *x,int N,int *order,int *seasonal,int constant,char *ic,int trace,int approx,
       double offset,double *xreg,int r,int *method)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  myarima_object pmVar5;
  double *pdVar6;
  sarimax_object psVar7;
  double *coeff;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  int q;
  long lVar12;
  int p;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  size_t __size;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ulong local_60;
  uint local_40;
  uint local_3c;
  
  pmVar5 = (myarima_object)malloc(0x38);
  pmVar5->aicc = 1.79769313486232e+308;
  pmVar5->bic = 1.79769313486232e+308;
  pmVar5->aic = 1.79769313486232e+308;
  pmVar5->ic = 1.79769313486232e+308;
  iVar4 = 0;
  local_60 = 0;
  iVar3 = 0;
  uVar13 = 0;
  if (order != (int *)0x0) {
    uVar13 = (ulong)(uint)*order;
    iVar3 = order[1];
    local_60 = (ulong)(uint)order[2];
  }
  local_40 = 0;
  iVar16 = 0;
  local_3c = 0;
  if (seasonal != (int *)0x0) {
    local_3c = *seasonal;
    iVar16 = seasonal[1];
    local_40 = seasonal[2];
    iVar4 = seasonal[3];
  }
  if (method == (int *)0x0) {
    iVar2 = (uint)(approx != 0) * 2;
  }
  else {
    iVar2 = *method;
  }
  p = (int)uVar13;
  q = (int)local_60;
  if (constant == 1 && iVar16 + iVar3 == 1) {
    lVar12 = (long)N * 8;
    pdVar6 = (double *)malloc((r + 1) * lVar12);
    if (0 < N) {
      uVar11 = 0;
      do {
        uVar14 = uVar11 + 1;
        pdVar6[uVar11] = (double)(int)uVar14;
        uVar11 = uVar14;
      } while ((uint)N != uVar14);
    }
    memcpy(pdVar6 + N,xreg,lVar12 * r);
    psVar7 = sarimax_init(p,iVar3,q,local_3c,iVar16,local_40,iVar4,r + 1,1,N);
    pmVar5->sarimax = psVar7;
    sarimax_exec(psVar7,x,pdVar6);
LAB_0010bb80:
    free(pdVar6);
  }
  else {
    if (0 < r) {
      __size = (ulong)(uint)r * (long)N * 8;
      pdVar6 = (double *)malloc(__size);
      memcpy(pdVar6,xreg,__size);
      psVar7 = sarimax_init(p,iVar3,q,local_3c,iVar16,local_40,iVar4,r,constant,N);
      pmVar5->sarimax = psVar7;
      if (iVar2 == 2) {
        psVar7->method = 2;
      }
      else if (iVar2 == 1) {
        psVar7->method = 1;
      }
      else if (iVar2 == 0) {
        psVar7->method = 0;
      }
      else {
        puts("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS ");
      }
      sarimax_exec(psVar7,x,pdVar6);
      goto LAB_0010bb80;
    }
    psVar7 = sarimax_init(p,iVar3,q,local_3c,iVar16,local_40,iVar4,0,constant,N);
    pmVar5->sarimax = psVar7;
    if (iVar2 == 2) {
      psVar7->method = 2;
    }
    else if (iVar2 == 1) {
      psVar7->method = 1;
    }
    else if (iVar2 == 0) {
      psVar7->method = 0;
    }
    else {
      puts("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS ");
    }
    sarimax_exec(psVar7,x,(double *)0x0);
  }
  psVar7 = pmVar5->sarimax;
  if (psVar7->retval != 1) {
    pmVar5->ic = 1.79769313486232e+308;
    return pmVar5;
  }
  iVar3 = psVar7->M;
  iVar16 = psVar7->q + psVar7->p + psVar7->P + psVar7->Q;
  iVar17 = iVar16 + iVar3 + 1;
  if (iVar2 == 2) {
    iVar2 = psVar7->Nused;
    dVar18 = log(psVar7->var);
    psVar7->aic = (double)(iVar17 * 2) + dVar18 * (double)iVar2 + offset;
  }
  iVar16 = iVar16 + iVar3;
  dVar18 = psVar7->aic;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    pmVar5->aic = dVar18;
    dVar19 = log((double)psVar7->Nused);
    dVar19 = (dVar19 + -2.0) * (double)iVar17 + dVar18;
    pmVar5->bic = dVar19;
    dVar20 = (double)((iVar16 + 2) * iVar17 * 2) / (double)((psVar7->Nused - iVar16) + -2) + dVar18;
    pmVar5->aicc = dVar20;
    iVar3 = strcmp(ic,"aic");
    if ((iVar3 != 0) &&
       ((iVar3 = strcmp(ic,"bic"), dVar18 = dVar19, iVar3 != 0 &&
        (iVar3 = strcmp(ic,"aicc"), dVar18 = dVar20, iVar3 != 0)))) goto LAB_0010bd1b;
  }
  else {
    pmVar5->aicc = 1.79769313486232e+308;
    pmVar5->bic = 1.79769313486232e+308;
    pmVar5->aic = 1.79769313486232e+308;
    dVar18 = 1.79769313486232e+308;
  }
  pmVar5->ic = dVar18;
LAB_0010bd1b:
  iVar3 = psVar7->Nused;
  if ((long)iVar3 < 1) {
    dVar18 = 0.0;
  }
  else {
    dVar18 = 0.0;
    lVar12 = 0;
    do {
      dVar18 = dVar18 + psVar7->res[lVar12] * psVar7->res[lVar12];
      lVar12 = lVar12 + 1;
    } while (iVar3 != lVar12);
  }
  pmVar5->sigma2 = dVar18 / (double)(iVar3 - iVar16);
  iVar16 = local_3c * iVar4 + p + 1;
  iVar3 = local_40 * iVar4 + q + 1;
  pdVar6 = (double *)calloc((long)iVar16,8);
  coeff = (double *)calloc((long)iVar3,8);
  *coeff = 1.0;
  *pdVar6 = 1.0;
  if (0 < p) {
    pdVar8 = psVar7->phi;
    uVar11 = 0;
    do {
      pdVar6[uVar11 + 1] = pdVar8[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  if (0 < q) {
    pdVar8 = psVar7->theta;
    uVar11 = 0;
    do {
      coeff[uVar11 + 1] = -pdVar8[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_60 != uVar11);
  }
  lVar12 = (long)iVar4;
  if (0 < (int)local_3c) {
    pdVar8 = psVar7->PHI;
    pdVar9 = pdVar6 + lVar12 + 1;
    uVar11 = 0;
    do {
      uVar14 = uVar11 + 1;
      pdVar6[uVar14 * lVar12] = pdVar8[uVar11] + pdVar6[uVar14 * lVar12];
      if (0 < p) {
        pdVar1 = psVar7->phi;
        uVar15 = 0;
        do {
          pdVar9[uVar15] = pdVar9[uVar15] - pdVar1[uVar15] * pdVar8[uVar11];
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      pdVar9 = pdVar9 + lVar12;
      uVar11 = uVar14;
    } while (uVar14 != local_3c);
  }
  if (0 < (int)local_40) {
    pdVar8 = psVar7->THETA;
    pdVar9 = coeff + lVar12 + 1;
    uVar13 = 0;
    do {
      uVar11 = uVar13 + 1;
      coeff[uVar11 * lVar12] = coeff[uVar11 * lVar12] - pdVar8[uVar13];
      if (0 < q) {
        pdVar1 = psVar7->theta;
        uVar14 = 0;
        do {
          pdVar9[uVar14] = pdVar1[uVar14] * pdVar8[uVar13] + pdVar9[uVar14];
          uVar14 = uVar14 + 1;
        } while (local_60 != uVar14);
      }
      pdVar9 = pdVar9 + lVar12;
      uVar13 = uVar11;
    } while (uVar11 != local_40);
  }
  if (iVar3 < iVar16) {
    iVar3 = iVar16;
  }
  pdVar8 = (double *)malloc((long)iVar3 << 3);
  pdVar9 = (double *)malloc((long)iVar3 << 3);
  dVar18 = 2.0;
  if (local_3c + p != 0 && SCARRY4(local_3c,p) == (int)(local_3c + p) < 0) {
    uVar10 = local_3c * iVar4 + p;
    if ((int)uVar10 < 1) {
      iVar3 = -1;
    }
    else {
      uVar11 = 0xffffffff;
      uVar13 = 0;
      do {
        if (1e-08 < ABS(pdVar6[uVar13 + 1])) {
          uVar11 = uVar13 & 0xffffffff;
        }
        iVar3 = (int)uVar11;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    if (-1 < iVar3) {
      uVar10 = iVar3 + 1;
      uVar13 = 0;
      do {
        pdVar6[uVar13 + 1] = -pdVar6[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      iVar3 = polyroot(pdVar6,uVar10,pdVar8,pdVar9);
      if (iVar3 == 0) {
        uVar13 = 0;
        dVar19 = 2.0;
        do {
          dVar18 = pdVar8[uVar13] * pdVar8[uVar13] + pdVar9[uVar13] * pdVar9[uVar13];
          if (dVar18 < 0.0) {
            dVar18 = sqrt(dVar18);
          }
          else {
            dVar18 = SQRT(dVar18);
          }
          if (dVar19 <= dVar18) {
            dVar18 = dVar19;
          }
          uVar13 = uVar13 + 1;
          dVar19 = dVar18;
        } while (uVar10 != uVar13);
      }
      else {
        pmVar5->ic = 1.79769313486232e+308;
        dVar18 = 2.0;
      }
    }
  }
  if ((1 < (int)(local_40 + q)) &&
     (pmVar5->ic <= 1.79769313486232e+308 && pmVar5->ic != 1.79769313486232e+308)) {
    uVar10 = local_40 * iVar4 + q;
    if ((int)uVar10 < 1) {
      iVar3 = -1;
    }
    else {
      uVar11 = 0xffffffff;
      uVar13 = 0;
      do {
        if (1e-08 < ABS(coeff[uVar13 + 1])) {
          uVar11 = uVar13 & 0xffffffff;
        }
        iVar3 = (int)uVar11;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    if (-1 < iVar3) {
      iVar4 = polyroot(coeff,iVar3 + 1U,pdVar8,pdVar9);
      if (iVar4 == 0) {
        uVar13 = 0;
        dVar19 = dVar18;
        do {
          dVar18 = pdVar8[uVar13] * pdVar8[uVar13] + pdVar9[uVar13] * pdVar9[uVar13];
          if (dVar18 < 0.0) {
            dVar18 = sqrt(dVar18);
          }
          else {
            dVar18 = SQRT(dVar18);
          }
          if (dVar19 <= dVar18) {
            dVar18 = dVar19;
          }
          uVar13 = uVar13 + 1;
          dVar19 = dVar18;
        } while (iVar3 + 1U != uVar13);
      }
      else {
        pmVar5->ic = 1.79769313486232e+308;
      }
    }
  }
  if (dVar18 < 1.01) {
    pmVar5->ic = 1.79769313486232e+308;
  }
  free(pdVar6);
  free(coeff);
  free(pdVar8);
  free(pdVar9);
  return pmVar5;
}

Assistant:

myarima_object myarima(double *x, int N, int *order, int *seasonal, int constant, const char* ic, int trace, int approx,
	double offset, double *xreg, int r, int *method) {

	myarima_object fit = NULL;
	int m,p,d,q,P,D,Q,s,diffs,i,j,imean,ncoeff,isum,imx,rr;
	int use_season,rmethod,last_nonzero,ip,iq,ir,retval;
	double rsum,minroot,tol,temp;
	double *xreg2,*phi,*theta,*zeror,*zeroi;
	int *K;

	fit = (myarima_object) malloc (sizeof(struct myarima_set));
	
	fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;

	tol = 1e-08;

	if (order) {
		p = order[0];
		d = order[1];
		q = order[2];
	} else {
		p = 0;
		d = 0;
		q = 0;
	}

	if (seasonal) {
		P = seasonal[0];
		D = seasonal[1];
		Q = seasonal[2];
		s = seasonal[3];
		if ( s > 0) {
			m = s;
		} else {
			m = 1;
		}
	} else {
		P = 0;
		D = 0;
		Q = 0;
		s = 0;
		m = 1;
	}

	diffs = d + D;

	if ( P + D + Q > 0 && s > 0) {
		use_season = 1;
	} else {
		use_season = 0;
	}

	if (method == NULL) {
		if (approx) {
			rmethod = 2;
		} else {
			rmethod = 0;
		}
	} else {
		rmethod = *method;
	}

	rr = r;

	if (diffs == 1 && constant == 1) {
		imean = 1;
		rr++;
		xreg2 = (double*)malloc(sizeof(double)*N*rr);
		for(i = 0; i < N;++i) {
			xreg2[i] = (double) (i+1);
		}
		memcpy(xreg2+N,xreg,sizeof(double)*N*(rr-1));
		fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
		sarimax_exec(fit->sarimax,x,xreg2);
		free(xreg2);
		//sarimax_summary(fit->sarimax);
	} else {
		imean = constant;
		if (rr > 0) {
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			memcpy(xreg2,xreg,sizeof(double)*N*rr);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			sarimax_exec(fit->sarimax,x,xreg2);
			free(xreg2);
		} else {
			//printf("p: %d d: %d q: %d P: %d D: %d Q: %d s: %d imean %d \n",p,d,q,P,D,Q,s,imean);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,0,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			//mdisplay(x,1,N);
			sarimax_exec(fit->sarimax,x,NULL);
			//sarimax_summary(fit->sarimax);
		}
		
	}

	if (fit->sarimax->retval == 1) {
		ncoeff = (fit->sarimax->p + fit->sarimax->q + fit->sarimax->P + fit->sarimax->Q + fit->sarimax->M) + 1;

		if (rmethod == 2) {
			fit->sarimax->aic = offset + fit->sarimax->Nused * log(fit->sarimax->var) + 2 * ncoeff;// sigma2 
		}

		if (fit->sarimax->aic) {
			fit->aic = fit->sarimax->aic;
			fit->bic = fit->aic + ncoeff * (log((double)fit->sarimax->Nused) - 2.0);
			fit->aicc = fit->aic + 2 * ncoeff * (ncoeff + 1) / (double) (fit->sarimax->Nused - ncoeff - 1);
			if (!strcmp(ic,"aic")) {
				fit->ic = fit->aic;
			} else if (!strcmp(ic,"bic")) {
				fit->ic = fit->bic;
			} else if (!strcmp(ic,"aicc")) {
				fit->ic = fit->aicc;
			}
		} else {
			fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;
		}

		//printf("aic %g bic %g aicc %g ic %g \n",fit->aic,fit->bic,fit->aicc,fit->ic);

		rsum = 0.0;

		for(i = 0; i < fit->sarimax->Nused;++i) {
			rsum += fit->sarimax->res[i]*fit->sarimax->res[i];
		}

		fit->sigma2 = rsum / (double) (fit->sarimax->Nused - ncoeff + 1);

		minroot = 2.0;

		ip = p + s*P + 1;
		iq = q + s*Q + 1;

		phi = (double*)calloc(ip,sizeof(double));
		theta = (double*)calloc(iq,sizeof(double));

		phi[0] = theta[0] = 1.0;

		for(i = 0; i < p;++i) {
			phi[i+1] = fit->sarimax->phi[i];
		}

		for(i = 0; i < q; ++i) {
			theta[i+1] = -1.0 * fit->sarimax->theta[i];
		}

		for (j = 0; j < P; ++j) {
			phi[(j + 1)*s] += fit->sarimax->PHI[j];
			for (i = 0; i < p; ++i) {
				phi[(j + 1)*s + i + 1] -= fit->sarimax->phi[i] * fit->sarimax->PHI[j];
			}
		}

		for (j = 0; j < Q; ++j) {
			theta[(j + 1)*s] -= fit->sarimax->THETA[j];
			for (i = 0; i < q; ++i) {
				theta[(j + 1)*s + i + 1] += fit->sarimax->theta[i] * fit->sarimax->THETA[j];
			}
		}

		ir = (ip > iq) ? ip : iq;

		K = (int*)malloc(sizeof(int)*ir);
		zeror = (double*)malloc(sizeof(double)*ir);
		zeroi = (double*)malloc(sizeof(double)*ir);

		//printf(" p P %d \n", p+P);

		if (p + P > 0) {
			isum = 0;
			imx = -1;
			for(i = 0; i < ip - 1; ++i) {
				K[i] = (fabs(phi[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {
				for(i = 0; i < last_nonzero; ++i) {
					phi[i+1] *= -1.0;
				}

				retval = polyroot(phi,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

		}

		//printf(" q Q %d \n", q+Q);

		if (q + Q > 1 && fit->ic < DBL_MAX) {
			isum = 0;
			imx = -1;
			for(i = 0; i < iq - 1; ++i) {
				K[i] = (fabs(theta[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {

				retval = polyroot(theta,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

			
		}

		if (minroot < 1.01) {
			fit->ic = DBL_MAX;
		}



		free(phi);
		free(theta);
		free(K);
		free(zeror);
		free(zeroi);
	} else {
		fit->ic = DBL_MAX;
	}

	return fit;
}